

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::setCursorVisible(QWidgetTextControlPrivate *this,bool visible)

{
  bool bVar1;
  Object *sender;
  long in_FS_OFFSET;
  Object local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->cursorVisible != visible) {
    this->cursorVisible = visible;
    updateCursorBlinking(this);
    bVar1 = this->cursorVisible;
    sender = (Object *)QGuiApplication::styleHints();
    if (bVar1 != true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QObjectPrivate::disconnect<void(QStyleHints::*)(int),void(QWidgetTextControlPrivate::*)()>
                  (sender,(offset_in_QStyleHints_to_subr)QStyleHints::cursorFlashTimeChanged,
                   (Object *)0x0,(Function)this);
        return;
      }
      goto LAB_0047c443;
    }
    QObjectPrivate::connect<void(QStyleHints::*)(int),void(QWidgetTextControlPrivate::*)()>
              (local_28,(offset_in_QStyleHints_to_subr)sender,
               (Object *)QStyleHints::cursorFlashTimeChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0047c443:
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setCursorVisible(bool visible)
{
    if (cursorVisible == visible)
        return;

    cursorVisible = visible;
    updateCursorBlinking();

    if (cursorVisible)
        connect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
    else
        disconnect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
}